

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O0

string * __thiscall
RenX::getFormattedPlayerName_abi_cxx11_
          (string *__return_storage_ptr__,RenX *this,PlayerInfo *player)

{
  string_view local_40 [2];
  undefined1 local_19;
  RenX *local_18;
  PlayerInfo *player_local;
  string *r;
  
  local_19 = 0;
  local_18 = this;
  player_local = (PlayerInfo *)__return_storage_ptr__;
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 400));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,"\x03");
  local_40[0] = getTeamColor(*(TeamType *)(local_18 + 0xf8));
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_40);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_18 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string RenX::getFormattedPlayerName(const RenX::PlayerInfo &player)
{
	std::string r = player.formatNamePrefix;
	r += IRCCOLOR;
	r += RenX::getTeamColor(player.team);
	r += player.name;
	return r;
}